

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.h
# Opt level: O3

void __thiscall llvm::APFloat::APFloat(APFloat *this,DoubleAPFloat *F,fltSemantics *S)

{
  undefined1 auStack_28 [8];
  __uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_> local_20;
  
  detail::DoubleAPFloat::DoubleAPFloat((DoubleAPFloat *)auStack_28,F);
  detail::DoubleAPFloat::DoubleAPFloat((DoubleAPFloat *)&(this->U).IEEE,(DoubleAPFloat *)auStack_28)
  ;
  if (S == (fltSemantics *)semPPCDoubleDouble) {
    if ((_Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>)
        local_20._M_t.super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
        .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl != (APFloat *)0x0) {
      std::default_delete<llvm::APFloat[]>::operator()
                ((default_delete<llvm::APFloat[]> *)&local_20,
                 (APFloat *)
                 local_20._M_t.
                 super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                 super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl);
    }
    return;
  }
  __assert_fail("&S == &PPCDoubleDouble()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APFloat.h"
                ,0x2b0,"llvm::APFloat::Storage::Storage(DoubleAPFloat, const fltSemantics &)");
}

Assistant:

explicit APFloat(DoubleAPFloat F, const fltSemantics &S)
      : U(std::move(F), S) {}